

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::Interpreter::UpdateNetworkSelectionInfo
          (Error *__return_storage_ptr__,Interpreter *this,bool onStart)

{
  Status SVar1;
  element_type *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_2b8;
  anon_class_1_0_00000001 local_292;
  v10 local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  char *local_288;
  string local_280;
  anon_class_1_0_00000001 local_25a;
  v10 local_259;
  v10 *local_258;
  size_t local_250;
  string local_248;
  Error local_228;
  undefined1 local_1f0 [8];
  Network nwk;
  bool onStart_local;
  Interpreter *this_local;
  Error *error;
  undefined1 local_160 [16];
  v10 *local_150;
  ulong local_148;
  v10 *local_140;
  size_t sStack_138;
  string *local_130;
  v10 *local_128;
  v10 **local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  undefined1 local_f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  char *local_e0;
  Network *local_d8;
  string *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  char *pcStack_c0;
  string *local_b8;
  v10 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  Error **local_80;
  undefined1 *local_78;
  Error **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  nwk._94_1_ = 0;
  nwk._95_1_ = onStart;
  Error::Error(__return_storage_ptr__);
  persistent_storage::Network::Network((Network *)local_1f0);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mRegistry);
  SVar1 = persistent_storage::Registry::GetCurrentNetwork(this_00,(Network *)local_1f0);
  if (SVar1 == kSuccess) {
    if (((nwk._95_1_ & 1) != 0) && (nwk.mName.field_2._8_8_ != 0)) {
      UpdateNetworkSelectionInfo::anon_class_1_0_00000001::operator()(&local_292);
      local_a8 = &local_290;
      local_b0 = &local_291;
      bVar2 = ::fmt::v10::operator()(local_b0);
      local_288 = (char *)bVar2.size_;
      local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar2.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      utils::Hex<unsigned_long>(&local_2b8,nwk.mName.field_2._8_8_);
      local_d8 = &nwk;
      local_b8 = &local_280;
      local_c8 = local_290;
      pcStack_c0 = local_288;
      local_d0 = &local_2b8;
      local_50 = &local_c8;
      local_e8 = local_290;
      local_e0 = local_288;
      local_48 = local_e8;
      pcStack_40 = local_e0;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
                (&local_118,(v10 *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 local_290);
      local_30 = local_f8;
      local_38 = &local_118;
      local_20 = 0xdd;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = local_e0;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_38;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_280,(v10 *)local_e8,fmt_00,args_00);
      Console::Write(&local_280,kGreen);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
  }
  else {
    UpdateNetworkSelectionInfo::anon_class_1_0_00000001::operator()(&local_25a);
    local_120 = &local_258;
    local_128 = &local_259;
    bVar2 = ::fmt::v10::operator()(local_128);
    local_250 = bVar2.size_;
    local_258 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_130 = &local_248;
    local_140 = local_258;
    sStack_138 = local_250;
    local_a0 = &local_140;
    local_150 = local_258;
    local_148 = local_250;
    local_98 = local_150;
    sStack_90 = local_148;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_78 = local_160;
    local_80 = &error;
    local_60 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_148;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_80;
    local_70 = local_80;
    local_68 = local_80;
    local_58 = local_78;
    ::fmt::v10::vformat_abi_cxx11_(&local_248,local_150,fmt,args);
    Error::Error(&local_228,kRegistryError,&local_248);
    Error::operator=(__return_storage_ptr__,&local_228);
    Error::~Error(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  Console::SetPrompt((string *)&nwk);
  nwk._94_1_ = 1;
  persistent_storage::Network::~Network((Network *)local_1f0);
  if ((nwk._94_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::UpdateNetworkSelectionInfo(bool onStart /*=false*/)
{
    Error   error;
    Network nwk;

    VerifyOrExit(mRegistry->GetCurrentNetwork(nwk) == Registry::Status::kSuccess,
                 error = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED));
    if (onStart && nwk.mXpan != 0)
    {
        Console::Write(fmt::format(FMT_STRING("Network selection recalled from previous session.\n"
                                              "Restored to [{}:'{}']"),
                                   utils::Hex(nwk.mXpan), nwk.mName),
                       Console::Color::kGreen);
    }
exit:
    Console::SetPrompt(nwk.mName);
    return error;
}